

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O2

void sha2_256_64(void *key,int len,uint32_t seed,void *out)

{
  uchar buf [32];
  undefined8 local_48 [4];
  
  sha256_init(&ltc_state);
  ltc_state.sha256.state[0] = seed ^ 0x6a09e667;
  sha256_process(&ltc_state,(uchar *)key,(long)len);
  sha256_done(&ltc_state,(uchar *)local_48);
  *(undefined8 *)out = local_48[0];
  return;
}

Assistant:

inline void sha2_256_64(const void *key, int len, uint32_t seed, void *out)
{
  // objsize
  unsigned char buf[32];
  sha256_init(&ltc_state);
  ltc_state.sha256.state[0] = 0x6A09E667UL ^ seed;
  sha256_process(&ltc_state, (unsigned char *)key, len);
  sha256_done(&ltc_state, buf);
  memcpy(out, buf, 8);
}